

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torturethread.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  int iVar2;
  undefined8 uVar3;
  int local_6c;
  int i;
  SDL_Thread *threads [10];
  char **argv_local;
  int argc_local;
  
  threads[9] = (SDL_Thread *)argv;
  iVar2 = SDL_Init(0);
  pFVar1 = _stderr;
  if (iVar2 < 0) {
    uVar3 = SDL_GetError();
    fprintf(pFVar1,"Couldn\'t initialize SDL: %s\n",uVar3);
    argv_local._4_4_ = 1;
  }
  else {
    signal(0xb,(__sighandler_t)0x0);
    for (local_6c = 0; local_6c < 10; local_6c = local_6c + 1) {
      time_for_threads_to_die[local_6c] = '\0';
      uVar3 = SDL_CreateThread(ThreadFunc,(long)local_6c);
      pFVar1 = _stderr;
      *(undefined8 *)(&stack0xffffffffffffff98 + (long)local_6c * 8) = uVar3;
      if (*(long *)(&stack0xffffffffffffff98 + (long)local_6c * 8) == 0) {
        uVar3 = SDL_GetError();
        fprintf(pFVar1,"Couldn\'t create thread: %s\n",uVar3);
        quit(1);
      }
    }
    for (local_6c = 0; local_6c < 10; local_6c = local_6c + 1) {
      time_for_threads_to_die[local_6c] = '\x01';
    }
    for (local_6c = 0; local_6c < 10; local_6c = local_6c + 1) {
      SDL_WaitThread(*(undefined8 *)(&stack0xffffffffffffff98 + (long)local_6c * 8),0);
    }
    SDL_Quit();
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
	SDL_Thread *threads[NUMTHREADS];
	int i;

	/* Load the SDL library */
	if ( SDL_Init(0) < 0 ) {
		fprintf(stderr, "Couldn't initialize SDL: %s\n",SDL_GetError());
		return(1);
	}

	signal(SIGSEGV, SIG_DFL);
	for(i = 0; i < NUMTHREADS; i++) {
		time_for_threads_to_die[i] = 0;
		threads[i] = SDL_CreateThread(ThreadFunc, (void *)(uintptr_t)i);
	
		if ( threads[i] == NULL ) {
			fprintf(stderr,
			"Couldn't create thread: %s\n", SDL_GetError());
			quit(1);
		}
	}

	for(i = 0; i < NUMTHREADS; i++) {
		time_for_threads_to_die[i] = 1;
	}

	for(i = 0; i < NUMTHREADS; i++) {
		SDL_WaitThread(threads[i], NULL);
	}
	SDL_Quit();
	return(0);
}